

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui.cc
# Opt level: O1

void curses_interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  double vol;
  undefined4 uVar1;
  pointer pcVar2;
  WINDOW *w_00;
  long lVar3;
  Player *pPVar4;
  size_type sVar5;
  _func_void_void_ptr *p_Var6;
  void *pvVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  Player_Type PVar12;
  uint uVar13;
  File_Selection_Code FVar14;
  long lVar15;
  char *pcVar16;
  _Head_base<0UL,_Player_*,_false> _Var17;
  char *pcVar18;
  undefined8 uVar19;
  Midi_Program_Ex *pMVar20;
  __uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true> _Var21;
  long *plVar22;
  size_type *psVar23;
  Midi_Spec spec;
  ulong uVar24;
  string *psVar25;
  undefined8 uVar26;
  undefined1 *puVar27;
  char *in_R8;
  char *in_R9;
  Program *pPVar28;
  short sVar29;
  uint channel;
  File_Selector fs;
  string bankname_field;
  WINDOW_u w;
  long local_12c8;
  IniProcessingVariant local_12b8;
  void *local_1288;
  string __str;
  undefined1 local_1258 [256];
  _Alloc_hider local_1158;
  size_type local_1150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1148;
  bool local_1138;
  uint local_1134;
  undefined4 uStack_1130;
  undefined4 uStack_112c;
  undefined4 uStack_1128;
  undefined4 uStack_1124;
  string local_1120;
  time_t local_1100;
  undefined5 uStack_10f8;
  undefined3 uStack_10f3;
  uint uStack_10f0;
  bool bStack_10ec;
  Midi_Spec local_10e8;
  undefined4 uStack_10e4;
  char *pcStack_10e0;
  _Head_base<0UL,_char_*,_false> _Stack_10d8;
  undefined8 local_10d0;
  _func_void_void_ptr *p_Stack_10c8;
  void *local_10c0;
  string local_10b8;
  undefined1 *local_1098 [2];
  undefined1 local_1088 [16];
  undefined1 *local_1078 [2];
  undefined1 local_1068 [16];
  undefined1 *local_1058 [2];
  undefined1 local_1048 [16];
  char pathbuf [4097];
  
  local_1288 = idle_data;
  initscr();
  local_1258[0] = false;
  local_1258._8_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._16_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._24_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._32_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._40_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._48_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._56_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._64_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._72_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  lVar15 = 0x50;
  do {
    *(undefined8 *)(local_1258 + lVar15) = 0;
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x60);
  lVar15 = 0x60;
  do {
    *(undefined8 *)(local_1258 + lVar15) = 0;
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0xe0);
  local_1158._M_p = (pointer)&local_1148;
  local_1258._240_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._248_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._224_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1258._232_8_ = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
  local_1150 = 0;
  local_1148._M_local_buf[0] = '\0';
  local_1138 = false;
  local_1120._M_dataplus._M_p = (pointer)&local_1120.field_2;
  local_1134 = 0;
  uStack_1130 = 0;
  uStack_112c = 0;
  uStack_1128 = 0;
  uStack_1124 = 0;
  local_1120._M_string_length = 0;
  local_1120.field_2._M_local_buf[0] = '\0';
  local_10e8 = GM;
  local_10d0._0_4_ = 0;
  local_10d0._4_4_ = 0;
  pcStack_10e0 = (char *)0x0;
  _Stack_10d8._M_head_impl = (char *)0x0;
  local_1100 = 0;
  uStack_10f8 = 0;
  uStack_10f3 = 0;
  uStack_10f0 = 0;
  bStack_10ec = false;
  local_10c0 = local_1288;
  p_Stack_10c8 = idle_proc;
  cVar8 = has_colors();
  if (cVar8 != '\0') {
    start_color();
    cVar8 = can_change_color();
    if (cVar8 != '\0') {
      init_color(0,0xb4,0xcb,0xd3);
      init_color(1,800,0,0);
      init_color(2,0x131,0x25b,0x17);
      init_color(3,0x300,0x273,0);
      init_color(4,0xcb,0x18c,0x283);
      init_color(5,0x1ca,0x139,0x1e2);
      init_color(6,0x17,0x254,0x25b);
      init_color(7,0x33b,0x34b,0x32b);
      init_color(8,0x14d,0x155,0x145);
      init_color(9,0x3a9,0xa0,0xa0);
      init_color(10,0x21d,0x376,0xcb);
      init_color(0xb,0x3c0,0x1da,0);
      init_color(0xc,0x1bf,0x26f,0x32b);
      init_color(0xd,0x2a6,0x1f2,0x292);
      init_color(0xe,0xcb,0x376,0x376);
      init_color(0xf,0x3a5,0x3a5,0x39d);
    }
    init_pair(1,7,0);
    init_pair(2,3,0);
    init_pair(3,0,7);
    init_pair(4,4,0);
    init_pair(5,2,0);
    init_pair(6,0,7);
    init_pair(7,4,0);
    init_pair(8,5,0);
    sVar29 = 9;
    lVar15 = 0;
    do {
      uVar13 = *(uint *)((long)&DAT_00198360 + lVar15);
      init_color((int)(short)(sVar29 + 7),(ulong)((uVar13 >> 0x10 & 0xff) * 1000) / 0xff,
                 (ulong)((uVar13 >> 8 & 0xff) * 1000) / 0xff,(ulong)((uVar13 & 0xff) * 1000) / 0xff)
      ;
      init_pair((int)sVar29,7,(int)(short)(sVar29 + 7));
      lVar15 = lVar15 + 4;
      sVar29 = sVar29 + 1;
    } while (lVar15 != 0x40);
  }
  raw();
  keypad(_stdscr,1);
  noecho();
  wtimeout(_stdscr,0x32);
  curs_set(0);
  set_escdelay(0x19);
  pcVar16 = getcwd(pathbuf,0x1001);
  sVar5 = local_1120._M_string_length;
  if (pcVar16 != (char *)0x0) {
    in_R8 = (char *)strlen(pcVar16);
    std::__cxx11::string::_M_replace((ulong)&local_1120,0,(char *)sVar5,(ulong)pcVar16);
  }
  pcVar16 = pathbuf + 0x10;
  pathbuf._0_8_ = pcVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)pathbuf,"tui","");
  IniProcessing::beginGroup(&configFile,(string *)pathbuf);
  if ((char *)pathbuf._0_8_ != pcVar16) {
    operator_delete((void *)pathbuf._0_8_);
  }
  IniProcessingVariant::IniProcessingVariant(&local_12b8,&local_1120);
  IniProcessing::value((IniProcessingVariant *)pathbuf,&configFile,"bank_directory",&local_12b8);
  IniProcessingVariant::toString_abi_cxx11_(&local_10b8,(IniProcessingVariant *)pathbuf);
  std::__cxx11::string::operator=((string *)&local_1120,(string *)&local_10b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
    operator_delete(local_10b8._M_dataplus._M_p);
  }
  if ((char *)pathbuf._0_8_ != pcVar16) {
    operator_delete((void *)pathbuf._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8.m_data._M_dataplus._M_p != &local_12b8.m_data.field_2) {
    operator_delete(local_12b8.m_data._M_dataplus._M_p);
  }
  IniProcessing::endGroup(&configFile);
  setup_display((TUI_context *)local_1258);
  pcVar16 = (char *)gettext("Ready!");
  std::__cxx11::string::string((string *)local_1058,pcVar16,(allocator *)pathbuf);
  std::__cxx11::string::operator=((string *)&local_1158,(string *)local_1058);
  local_1138 = false;
  local_1134 = 10;
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0]);
  }
  local_12c8 = std::chrono::_V2::steady_clock::now();
  do {
    pcVar16 = pathbuf + 0x10;
    if (((bool)local_1258[0] != false) || (bVar9 = interface_interrupted(), bVar9)) {
      memset(pathbuf,0,0xf8);
      lVar15 = 0x48;
      do {
        pcVar16 = pathbuf + lVar15;
        pcVar16[0] = '\0';
        pcVar16[1] = '\0';
        pcVar16[2] = '\0';
        pcVar16[3] = '\0';
        pcVar16[4] = '\0';
        pcVar16[5] = '\0';
        pcVar16[6] = '\0';
        pcVar16[7] = '\0';
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x58);
      lVar15 = 0x58;
      do {
        pcVar16 = pathbuf + lVar15;
        pcVar16[0] = '\0';
        pcVar16[1] = '\0';
        pcVar16[2] = '\0';
        pcVar16[3] = '\0';
        pcVar16[4] = '\0';
        pcVar16[5] = '\0';
        pcVar16[6] = '\0';
        pcVar16[7] = '\0';
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0xd8);
      pathbuf[0xe8] = '\0';
      pathbuf[0xe9] = '\0';
      pathbuf[0xea] = '\0';
      pathbuf[0xeb] = '\0';
      pathbuf[0xec] = '\0';
      pathbuf[0xed] = '\0';
      pathbuf[0xee] = '\0';
      pathbuf[0xef] = '\0';
      pathbuf[0xf0] = '\0';
      pathbuf[0xf1] = '\0';
      pathbuf[0xf2] = '\0';
      pathbuf[0xf3] = '\0';
      pathbuf[0xf4] = '\0';
      pathbuf[0xf5] = '\0';
      pathbuf[0xf6] = '\0';
      pathbuf[0xf7] = '\0';
      pathbuf[0xd8] = '\0';
      pathbuf[0xd9] = '\0';
      pathbuf[0xda] = '\0';
      pathbuf[0xdb] = '\0';
      pathbuf[0xdc] = '\0';
      pathbuf[0xdd] = '\0';
      pathbuf[0xde] = '\0';
      pathbuf[0xdf] = '\0';
      pathbuf[0xe0] = '\0';
      pathbuf[0xe1] = '\0';
      pathbuf[0xe2] = '\0';
      pathbuf[0xe3] = '\0';
      pathbuf[0xe4] = '\0';
      pathbuf[0xe5] = '\0';
      pathbuf[0xe6] = '\0';
      pathbuf[0xe7] = '\0';
      TUI_windows::operator=((TUI_windows *)(local_1258 + 8),(TUI_windows *)pathbuf);
      TUI_windows::~TUI_windows((TUI_windows *)pathbuf);
      endwin();
      bVar9 = interface_interrupted();
      if (bVar9) {
        curses_interface_exec();
      }
      if ((_Head_base<0UL,_char_*,_false>)_Stack_10d8._M_head_impl !=
          (_Head_base<0UL,_char_*,_false>)0x0) {
        operator_delete__(_Stack_10d8._M_head_impl);
      }
      _Stack_10d8._M_head_impl = (char *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1120._M_dataplus._M_p != &local_1120.field_2) {
        operator_delete(local_1120._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1158._M_p != &local_1148) {
        operator_delete(local_1158._M_p);
      }
      TUI_windows::~TUI_windows((TUI_windows *)(local_1258 + 8));
      return;
    }
    if (idle_proc != (_func_void_void_ptr *)0x0) {
      (*idle_proc)(local_1288);
    }
    handle_notifications((TUI_context *)local_1258);
    if ((ulong)active_emulator_id == 0xffffffff) {
      _Var17._M_head_impl = (Player *)0x0;
    }
    else {
      _Var17._M_head_impl =
           player[emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl
                  .super__Vector_impl_data._M_start[active_emulator_id].player]._M_t.
           super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
           super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
           super__Head_base<0UL,_Player_*,_false>._M_head_impl;
    }
    if ((Player *)CONCAT44(uStack_1124,uStack_1128) != _Var17._M_head_impl) {
      uStack_1128 = SUB84(_Var17._M_head_impl,0);
      uStack_1124 = (undefined4)((ulong)_Var17._M_head_impl >> 0x20);
      update_bank_mtime((TUI_context *)local_1258);
    }
    lVar15 = std::chrono::_V2::steady_clock::now();
    if ((1000000000 < lVar15 - local_12c8) &&
       (bVar9 = update_bank_mtime((TUI_context *)local_1258), local_12c8 = lVar15, bVar9)) {
      if ((ulong)active_emulator_id == 0xffffffff) {
        uVar24 = 0;
      }
      else {
        uVar24 = (ulong)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                        _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
      }
      bVar9 = Player::dynamic_load_bank
                        ((Player *)CONCAT44(uStack_1124,uStack_1128),
                         player_bank_file_abi_cxx11_[uVar24]._M_dataplus._M_p);
      if (bVar9) {
        pcVar18 = (char *)gettext("Bank has changed on disk. Reload!");
        std::__cxx11::string::string((string *)local_1078,pcVar18,(allocator *)pathbuf);
        std::__cxx11::string::operator=((string *)&local_1158,(string *)local_1078);
        local_1138 = false;
        local_1134 = 10;
        puVar27 = local_1078[0];
        if (local_1078[0] != local_1068) {
LAB_00118547:
          local_1134 = 10;
          local_1138 = false;
          operator_delete(puVar27);
        }
      }
      else {
        pcVar18 = (char *)gettext("Bank has changed on disk. Reloading failed.");
        std::__cxx11::string::string((string *)local_1098,pcVar18,(allocator *)pathbuf);
        std::__cxx11::string::operator=((string *)&local_1158,(string *)local_1098);
        local_1138 = false;
        local_1134 = 10;
        puVar27 = local_1098[0];
        if (local_1098[0] != local_1088) goto LAB_00118547;
      }
    }
    uVar26 = local_1258._8_8_;
    pPVar4 = (Player *)CONCAT44(uStack_1124,uStack_1128);
    if ((_win_st *)local_1258._8_8_ != (_win_st *)0x0) {
      get_program_title_abi_cxx11_();
      uVar19 = pathbuf._8_8_;
      wattr_on(uVar26,0x200400,0);
      in_R8 = (char *)0x2d;
      in_R9 = (char *)0x2d;
      wborder(uVar26,0x20,0x20,0x2d,0x2d,0x2d,0x2d,0x2d,0x2d);
      wattr_off(uVar26,0x200400,0);
      iVar10 = -1;
      if (_stdscr != 0) {
        iVar10 = *(short *)(_stdscr + 6) + 1;
      }
      iVar11 = -1;
      if (_stdscr != 0) {
        iVar11 = (int)*(short *)(_stdscr + 10);
      }
      uVar24 = uVar19 + 2;
      if (uVar24 <= (uint)(iVar10 - iVar11)) {
        wattr_on(uVar26,0x200400,0);
        uVar24 = (uint)(iVar10 - iVar11) - uVar24 >> 1;
        iVar10 = wmove(uVar26,0,uVar24 & 0xffffffff);
        if (iVar10 != -1) {
          waddch(uVar26,0x28);
        }
        iVar10 = (int)uVar24;
        iVar11 = wmove(uVar26,0,iVar10 + (int)uVar19 + 1);
        if (iVar11 != -1) {
          waddch(uVar26,0x29);
        }
        wattr_off(uVar26,0x200400,0);
        iVar10 = wmove(uVar26,0,iVar10 + 1);
        if (iVar10 != -1) {
          waddnstr(uVar26,pathbuf._0_8_,0xffffffff);
        }
      }
      wnoutrefresh(uVar26);
      if ((char *)pathbuf._0_8_ != pcVar16) {
        operator_delete((void *)pathbuf._0_8_);
      }
    }
    uVar26 = local_1258._24_8_;
    if ((_win_st *)local_1258._24_8_ != (_win_st *)0x0) {
      iVar10 = wmove(local_1258._24_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Player");
        waddnstr(uVar26,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar26,0x200,0);
        PVar12 = (*pPVar4->_vptr_Player[3])(pPVar4);
        in_R8 = Player::name(PVar12);
        PVar12 = (*pPVar4->_vptr_Player[3])(pPVar4);
        in_R9 = Player::version(PVar12);
        mvwprintw(uVar26,0,0xf,"%s %s");
        wattr_off(uVar26,0x200,0);
      }
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    uVar26 = local_1258._32_8_;
    if ((_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)local_1258._32_8_ != (_win_st *)0x0) {
      iVar10 = wmove(local_1258._32_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Emulator");
        waddnstr(uVar26,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar26,0x200,0);
        iVar10 = wmove(uVar26,0,0xf);
        if (iVar10 != -1) {
          iVar10 = (*pPVar4->_vptr_Player[6])(pPVar4);
          waddnstr(uVar26,iVar10,0xffffffff);
        }
        wattr_off(uVar26,0x200,0);
      }
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    uVar26 = local_1258._40_8_;
    if ((_win_st *)local_1258._40_8_ != (_win_st *)0x0) {
      iVar10 = wmove(local_1258._40_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Chips");
        waddnstr(uVar26,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar26,0x200,0);
        uVar13 = (*pPVar4->_vptr_Player[10])(pPVar4);
        in_R8 = (char *)(ulong)uVar13;
        mvwprintw(uVar26,0,0xf,"%u");
        wattr_off(uVar26,0x200,0);
        waddnstr(uVar26," * ",0xffffffff);
        wattr_on(uVar26,0x200,0);
        PVar12 = (*pPVar4->_vptr_Player[3])(pPVar4);
        pcVar18 = Player::chip_name(PVar12);
        waddnstr(uVar26,pcVar18,0xffffffff);
        wattr_off(uVar26,0x200,0);
      }
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    uVar26 = local_1258._48_8_;
    if ((_win_st *)local_1258._48_8_ != (_win_st *)0x0) {
      iVar10 = wmove(local_1258._48_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("CPU");
        waddnstr(uVar26,uVar19,0xffffffff);
      }
      print_bar((WINDOW *)uVar26,0xf,0xf,0x200,cpuratio,(char)in_R8,(char)in_R9,
                (int)fs.P._M_t.
                     super___uniq_ptr_impl<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_File_Selector::Impl_*,_std::default_delete<File_Selector::Impl>_>
                     .super__Head_base<0UL,_File_Selector::Impl_*,_false>._M_head_impl);
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    uVar26 = local_1258._56_8_;
    if ((_win_st *)local_1258._56_8_ != (_win_st *)0x0) {
      iVar10 = wmove(local_1258._56_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Bank");
        waddnstr(uVar26,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        pathbuf[8] = '\0';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._16_4_ = pathbuf._16_4_ & 0xffffff00;
        if ((ulong)active_emulator_id == 0xffffffff) {
          uVar24 = 0;
        }
        else {
          uVar24 = (ulong)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>
                          ._M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
        }
        pathbuf._0_8_ = pcVar16;
        if (player_bank_file_abi_cxx11_[uVar24]._M_string_length == 0) {
          pcVar18 = (char *)gettext("(default)");
          uVar19 = pathbuf._8_8_;
          in_R8 = (char *)strlen(pcVar18);
          std::__cxx11::string::_M_replace((ulong)pathbuf,0,(char *)uVar19,(ulong)pcVar18);
        }
        else {
          psVar25 = player_bank_file_abi_cxx11_ + uVar24;
          lVar15 = std::__cxx11::string::rfind((char)psVar25,0x2f);
          if (lVar15 == -1) {
            local_12b8.m_data._M_dataplus._M_p = (pointer)&local_12b8.m_data.field_2;
            pcVar2 = (psVar25->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_12b8,pcVar2,
                       pcVar2 + player_bank_file_abi_cxx11_[uVar24]._M_string_length);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_12b8,(ulong)psVar25);
          }
          std::__cxx11::string::_M_assign((string *)pathbuf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12b8.m_data._M_dataplus._M_p != &local_12b8.m_data.field_2) {
            operator_delete(local_12b8.m_data._M_dataplus._M_p);
          }
        }
        wattr_on(uVar26,0x200,0);
        iVar10 = wmove(uVar26,0,0xf);
        if (iVar10 != -1) {
          waddnstr(uVar26,pathbuf._0_8_,0xffffffff);
        }
        wattr_off(uVar26,0x200,0);
        if ((char *)pathbuf._0_8_ != pcVar16) {
          operator_delete((void *)pathbuf._0_8_);
        }
      }
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    uVar26 = local_1258._64_8_;
    if ((_win_st *)local_1258._64_8_ != (_win_st *)0x0) {
      iVar10 = wmove(local_1258._64_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Alloc mode");
        waddnstr(uVar26,uVar19,0xffffffff);
      }
      if (pPVar4 != (Player *)0x0) {
        wattr_on(uVar26,0x200,0);
        iVar10 = wmove(uVar26,0,0xf);
        if (iVar10 != -1) {
          pcVar16 = Player::get_channel_alloc_mode_name(pPVar4);
          waddnstr(uVar26,pcVar16,0xffffffff);
        }
        wattr_off(uVar26,0x200,0);
      }
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    pathbuf[4] = lvcurrent[0]._4_1_;
    pathbuf[5] = lvcurrent[0]._5_1_;
    pathbuf[6] = lvcurrent[0]._6_1_;
    pathbuf[7] = lvcurrent[0]._7_1_;
    pathbuf[0] = lvcurrent[0]._0_1_;
    pathbuf[1] = lvcurrent[0]._1_1_;
    pathbuf[2] = lvcurrent[0]._2_1_;
    pathbuf[3] = lvcurrent[0]._3_1_;
    pathbuf[0xc] = lvcurrent[1]._4_1_;
    pathbuf[0xd] = lvcurrent[1]._5_1_;
    pathbuf[0xe] = lvcurrent[1]._6_1_;
    pathbuf[0xf] = lvcurrent[1]._7_1_;
    pathbuf[8] = lvcurrent[1]._0_1_;
    pathbuf[9] = lvcurrent[1]._1_1_;
    pathbuf[10] = lvcurrent[1]._2_1_;
    pathbuf[0xb] = lvcurrent[1]._3_1_;
    local_12b8.m_data._M_dataplus._M_p = (pointer)gettext("Left");
    local_12b8.m_data._M_string_length = gettext("Right");
    uVar26 = local_1258._72_8_;
    if ((_win_st *)local_1258._72_8_ != (_win_st *)0x0) {
      iVar10 = wmove(local_1258._72_8_,0,0);
      if (iVar10 != -1) {
        uVar19 = gettext("Volume");
        waddnstr(uVar26,uVar19,0xffffffff);
      }
      wattr_on(uVar26,0x200,0);
      in_R8 = (char *)(ulong)(uint)player_volume;
      mvwprintw(uVar26,0,0xf,"%3d%%\n");
      wattr_off(uVar26,0x200,0);
      wclrtoeol(uVar26);
      wrefresh(uVar26);
    }
    lVar15 = 0;
    do {
      w_00 = *(WINDOW **)(local_1258 + (lVar15 + -2) * 8 + 0x60);
      if (w_00 != (WINDOW *)0x0) {
        vol = *(double *)(pathbuf + lVar15 * 8);
        iVar10 = wmove(w_00,0,0);
        if (iVar10 != -1) {
          waddnstr(w_00,(&local_12b8.m_data._M_dataplus)[lVar15]._M_p,0xffffffff);
        }
        print_bar(w_00,7,((int)w_00->_maxx - (int)w_00->_begx) + -6,0x200500,vol,(char)in_R8,
                  (char)in_R9,
                  (int)fs.P._M_t.
                       super___uniq_ptr_impl<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_File_Selector::Impl_*,_std::default_delete<File_Selector::Impl>_>
                       .super__Head_base<0UL,_File_Selector::Impl_*,_false>._M_head_impl);
        wclrtoeol(w_00);
        wnoutrefresh(w_00);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 == 1);
    pPVar28 = channel_map;
    lVar15 = 0;
    do {
      lVar3 = *(long *)(local_1258 + lVar15 * 8 + 0x60);
      if (lVar3 != 0) {
        in_R8 = (char *)(ulong)((int)lVar15 + 1);
        mvwprintw(lVar3,0,0,"%2u: [");
        wattr_on(lVar3,&uleb128_00200800,0);
        wprintw(lVar3,"%3u",pPVar28->gm);
        wattr_off(lVar3,&uleb128_00200800,0);
        waddnstr(lVar3,"]",0xffffffff);
        uVar13 = midi_channel_note_count[lVar15];
        wattr_on(lVar3,&DWORD_00200500,0);
        iVar10 = wmove(lVar3,0,0xb);
        if (iVar10 != -1) {
          uVar26 = 0x2a;
          if (uVar13 == 0) {
            uVar26 = 0x20;
          }
          waddch(lVar3,uVar26);
        }
        wattr_off(lVar3,&DWORD_00200500,0);
        if (lVar15 == 9) {
          uStack_10f0 = uStack_10f0 + 1;
          if ((uStack_10f0 == 10) && (uStack_10f0 = 0, midi_channel_last_note_p1[9] != 0)) {
            uVar13 = midi_channel_last_note_p1[9] - 1;
            bStack_10ec = true;
            local_10e8 = midi_db.midi_perc_[uVar13].spec;
            uStack_10e4 = *(undefined4 *)&midi_db.midi_perc_[uVar13].field_0x4;
            pcStack_10e0 = midi_db.midi_perc_[uVar13].name;
          }
          pcVar16 = pcStack_10e0;
          spec = local_10e8;
          if (bStack_10ec == false) {
            pcVar16 = (char *)gettext("Percussion");
            spec = GM;
          }
        }
        else {
          if ((pPVar28->bank_lsb == 0 && pPVar28->bank_msb == 0) ||
             (pMVar20 = Midi_Db::find_ex(&midi_db,pPVar28->bank_msb,pPVar28->bank_lsb,pPVar28->gm),
             pMVar20 == (Midi_Program_Ex *)0x0)) {
            spec = GM;
            pcVar16 = (char *)0x0;
          }
          else {
            spec = pMVar20->spec;
            pcVar16 = pMVar20->name;
          }
          if (pcVar16 == (char *)0x0) {
            pcVar16 = midi_db.midi_inst_[pPVar28->gm];
          }
        }
        uVar1 = (&DAT_001983a0)[spec];
        wattr_on(lVar3,uVar1,0);
        iVar10 = wmove(lVar3,0,0xc);
        if (iVar10 != -1) {
          waddnstr(lVar3,pcVar16,0xffffffff);
        }
        wattr_off(lVar3,uVar1,0);
        if (spec != GM) {
          pcVar16 = midi_spec_name(spec);
          wprintw(lVar3," [%s]",pcVar16);
        }
        wclrtoeol(lVar3);
        wrefresh(lVar3);
      }
      uVar26 = local_1258._224_8_;
      lVar15 = lVar15 + 1;
      pPVar28 = pPVar28 + 1;
    } while (lVar15 != 0x10);
    pcVar16 = pathbuf + 0x10;
    if (((_win_st *)local_1258._224_8_ != (_win_st *)0x0) && (local_1150 != 0)) {
      if (local_1138 == false) {
        wattr_on(local_1258._224_8_,0x300,0);
        iVar10 = wmove(uVar26,0,0);
        if (iVar10 != -1) {
          waddnstr(uVar26,local_1158._M_p,0xffffffff);
        }
        wattr_off(uVar26,0x300,0);
        uVar19 = std::chrono::_V2::steady_clock::now();
        uStack_1130 = (undefined4)uVar19;
        uStack_112c = (undefined4)((ulong)uVar19 >> 0x20);
        local_1138 = true;
        wclrtoeol(uVar26);
      }
      else {
        lVar15 = std::chrono::_V2::steady_clock::now();
        if (lVar15 - CONCAT44(uStack_112c,uStack_1130) <= (long)((ulong)local_1134 * 1000000000))
        goto LAB_0011900f;
        local_1150 = 0;
        *local_1158._M_p = '\0';
        local_1138 = false;
        werase(uVar26);
      }
      wnoutrefresh(uVar26);
    }
LAB_0011900f:
    uVar26 = local_1258._232_8_;
    if ((_Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>)local_1258._232_8_ != (_win_st *)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      uVar24 = 0;
      do {
        wmove(uVar26,0,uVar24 & 0xffffffff);
        wattr_on(uVar26,0x600,0);
        waddnstr(uVar26,*(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar24),
                 0xffffffff);
        wattr_off(uVar26,0x600,0);
        waddnstr(uVar26," ",0xffffffff);
        waddnstr(uVar26,*(undefined8 *)((long)&DAT_002222f8 + uVar24),0xffffffff);
        uVar24 = uVar24 + 0x10;
      } while (uVar24 != 0x50);
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    uVar26 = local_1258._240_8_;
    if ((_win_st *)local_1258._240_8_ != (_win_st *)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      uVar24 = 0;
      do {
        wmove(uVar26,0,uVar24 & 0xffffffff);
        wattr_on(uVar26,0x600,0);
        waddnstr(uVar26,*(undefined8 *)((long)&update_display(TUI_context&)::keydesc + uVar24),
                 0xffffffff);
        wattr_off(uVar26,0x600,0);
        waddnstr(uVar26," ",0xffffffff);
        waddnstr(uVar26,*(undefined8 *)((long)&DAT_00222358 + uVar24),0xffffffff);
        uVar24 = uVar24 + 0x10;
      } while (uVar24 != 0x50);
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    uVar26 = local_1258._248_8_;
    if ((_win_st *)local_1258._248_8_ != (_win_st *)0x0) {
      if (update_display(TUI_context&)::keydesc == '\0') {
        curses_interface_exec();
      }
      wmove(uVar26,0,0);
      wattr_on(uVar26,0x600,0);
      waddnstr(uVar26,update_display(TUI_context&)::keydesc,0xffffffff);
      wattr_off(uVar26,0x600,0);
      waddnstr(uVar26," ",0xffffffff);
      waddnstr(uVar26,DAT_002223b8,0xffffffff);
      wclrtoeol(uVar26);
      wnoutrefresh(uVar26);
    }
    iVar10 = wgetch(_stdscr);
    bVar9 = handle_anylevel_key((TUI_context *)local_1258,iVar10);
    if ((bVar9) || (pPVar4 = (Player *)CONCAT44(uStack_1124,uStack_1128), pPVar4 == (Player *)0x0))
    goto switchD_00119258_caseD_3d;
    if (0x4f < iVar10) {
      switch(iVar10) {
      case 0x5b:
        uVar13 = (*pPVar4->_vptr_Player[10])(pPVar4);
        if (1 < uVar13) {
          Player::dynamic_set_chip_count(pPVar4,uVar13 - 1);
          builtin_strncpy(pathbuf + 0x10,"synth",6);
          pathbuf[8] = '\x05';
          pathbuf[9] = '\0';
          pathbuf[10] = '\0';
          pathbuf[0xb] = '\0';
          pathbuf[0xc] = '\0';
          pathbuf[0xd] = '\0';
          pathbuf[0xe] = '\0';
          pathbuf[0xf] = '\0';
          pathbuf._0_8_ = pcVar16;
          IniProcessing::beginGroup(&configFile,(string *)pathbuf);
          goto joined_r0x00119a01;
        }
        break;
      case 0x5c:
      case 0x5e:
      case 0x5f:
      case 0x60:
        break;
      case 0x5d:
        iVar10 = (*pPVar4->_vptr_Player[10])(pPVar4);
        Player::dynamic_set_chip_count(pPVar4,iVar10 + 1);
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pcVar16;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
joined_r0x00119a01:
        if ((char *)pathbuf._0_8_ != pcVar16) {
          operator_delete((void *)pathbuf._0_8_);
        }
        PVar12 = (*pPVar4->_vptr_Player[10])(pPVar4);
        pcVar16 = "nchip";
LAB_00119aae:
        IniProcessing::setValue(&configFile,pcVar16,PVar12);
        goto LAB_00119abc;
      case 0x61:
        goto switchD_00119258_caseD_41;
      case 0x62:
        goto switchD_00119258_caseD_42;
      case 99:
        goto switchD_00119258_caseD_43;
      default:
        if ((iVar10 == 0x50) || (iVar10 == 0x70)) {
          Player::dynamic_panic(pPVar4);
        }
      }
      goto switchD_00119258_caseD_3d;
    }
    switch(iVar10) {
    case 0x3c:
      if (active_emulator_id != 0) {
        dynamic_switch_emulator_id(active_emulator_id - 1);
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pcVar16;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        if ((char *)pathbuf._0_8_ != pcVar16) {
          operator_delete((void *)pathbuf._0_8_);
        }
        IniProcessing::setValue(&configFile,"emulator",pPVar4->emulator_);
LAB_00119978:
        if (active_emulator_id == 0xffffffff) {
          PVar12 = OPL3;
        }
        else {
          PVar12 = emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                   _M_impl.super__Vector_impl_data._M_start[active_emulator_id].player;
        }
        pcVar16 = "pt";
        goto LAB_00119aae;
      }
      break;
    case 0x3d:
    case 0x3f:
    case 0x40:
      break;
    case 0x3e:
      uVar13 = active_emulator_id + 1;
      uVar24 = ((long)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)emulator_ids.super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar13 <= uVar24 && uVar24 - uVar13 != 0) {
        dynamic_switch_emulator_id(uVar13);
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pcVar16;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
        if ((char *)pathbuf._0_8_ != pcVar16) {
          operator_delete((void *)pathbuf._0_8_);
        }
        IniProcessing::setValue(&configFile,"emulator",pPVar4->emulator_);
        goto LAB_00119978;
      }
      break;
    case 0x41:
switchD_00119258_caseD_41:
      iVar11 = (*pPVar4->_vptr_Player[0xf])(pPVar4);
      iVar10 = iVar11 + 1;
      if (1 < iVar11) {
        iVar10 = -1;
      }
      Player::dynamic_set_channel_alloc(pPVar4,iVar10);
      builtin_strncpy(pathbuf + 0x10,"synth",6);
      pathbuf[8] = '\x05';
      pathbuf[9] = '\0';
      pathbuf[10] = '\0';
      pathbuf[0xb] = '\0';
      pathbuf[0xc] = '\0';
      pathbuf[0xd] = '\0';
      pathbuf[0xe] = '\0';
      pathbuf[0xf] = '\0';
      pathbuf._0_8_ = pcVar16;
      IniProcessing::beginGroup(&configFile,(string *)pathbuf);
      if ((char *)pathbuf._0_8_ != pcVar16) {
        operator_delete((void *)pathbuf._0_8_);
      }
      pcVar16 = "chanalloc";
      goto LAB_00119a95;
    case 0x42:
switchD_00119258_caseD_42:
      erase();
      pathbuf[8] = '\0';
      pathbuf[9] = '\0';
      pathbuf[10] = '\0';
      pathbuf[0xb] = '\0';
      pathbuf[0xc] = '\0';
      pathbuf[0xd] = '\0';
      pathbuf[0xe] = '\0';
      pathbuf[0xf] = '\0';
      pathbuf._16_4_ = pathbuf._16_4_ & 0xffffff00;
      pathbuf._32_8_ = pathbuf + 0x30;
      pathbuf[0x28] = '\0';
      pathbuf[0x29] = '\0';
      pathbuf[0x2a] = '\0';
      pathbuf[0x2b] = '\0';
      pathbuf[0x2c] = '\0';
      pathbuf[0x2d] = '\0';
      pathbuf[0x2e] = '\0';
      pathbuf[0x2f] = '\0';
      pathbuf[0x30] = '\0';
      pathbuf._64_8_ = pathbuf + 0x50;
      pathbuf[0x48] = '\0';
      pathbuf[0x49] = '\0';
      pathbuf[0x4a] = '\0';
      pathbuf[0x4b] = '\0';
      pathbuf[0x4c] = '\0';
      pathbuf[0x4d] = '\0';
      pathbuf[0x4e] = '\0';
      pathbuf[0x4f] = '\0';
      pathbuf[0x50] = '\0';
      pathbuf[0x60] = '\0';
      pathbuf._0_8_ = pcVar16;
      pcVar18 = (char *)gettext("Load bank");
      uVar26 = pathbuf._72_8_;
      strlen(pcVar18);
      std::__cxx11::string::_M_replace((ulong)(pathbuf + 0x40),0,(char *)uVar26,(ulong)pcVar18);
      std::__cxx11::string::_M_assign((string *)pathbuf);
      File_Selector::File_Selector(&fs,(File_Selection_Options *)pathbuf);
      w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
      super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.super__Head_base<0UL,__win_st_*,_false>.
      _M_head_impl = (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                     derwin(_stdscr,_LINES,_COLS,0,0);
      File_Selector::setup_display
                (&fs,(WINDOW *)
                     w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                     super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                     super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
      File_Selector::update(&fs);
      pvVar7 = local_10c0;
      p_Var6 = p_Stack_10c8;
      iVar10 = wgetch(_stdscr);
      FVar14 = Continue;
      while (((bool)local_1258[0] == false &&
             (bVar9 = interface_interrupted(), FVar14 == Continue && !bVar9))) {
        if (p_Var6 != (_func_void_void_ptr *)0x0) {
          (*p_Var6)(pvVar7);
        }
        handle_notifications((TUI_context *)local_1258);
        bVar9 = handle_anylevel_key((TUI_context *)local_1258,iVar10);
        if (bVar9) {
          FVar14 = Continue;
          if (iVar10 == 0x19a) {
            _Var21.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
            super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
            super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)derwin(_stdscr,_LINES,_COLS,0,0);
            bVar9 = (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)
                    w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                    super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                    super__Head_base<0UL,__win_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<_win_st,_WINDOW_deleter>)0x0;
            w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
            super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
            super__Head_base<0UL,__win_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 (__uniq_ptr_data<_win_st,_WINDOW_deleter,_true,_true>)
                 _Var21.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                 super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                 super__Head_base<0UL,__win_st_*,_false>._M_head_impl;
            if (bVar9) {
              delwin();
            }
            File_Selector::setup_display
                      (&fs,(WINDOW *)
                           w._M_t.super___uniq_ptr_impl<_win_st,_WINDOW_deleter>._M_t.
                           super__Tuple_impl<0UL,__win_st_*,_WINDOW_deleter>.
                           super__Head_base<0UL,__win_st_*,_false>._M_head_impl);
          }
        }
        else {
          FVar14 = File_Selector::key(&fs,iVar10);
          File_Selector::update(&fs);
        }
        doupdate();
        iVar10 = wgetch(_stdscr);
      }
      if (FVar14 == Ok) {
        bVar9 = Player::dynamic_load_bank(pPVar4,(char *)pathbuf._32_8_);
        if (bVar9) {
          pcVar18 = (char *)gettext("Bank loaded!");
          std::__cxx11::string::string((string *)&local_12b8,pcVar18,(allocator *)&bankname_field);
          std::__cxx11::string::operator=((string *)&local_1158,(string *)&local_12b8);
          local_1138 = false;
          local_1134 = 10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12b8.m_data._M_dataplus._M_p != &local_12b8.m_data.field_2) {
            operator_delete(local_12b8.m_data._M_dataplus._M_p);
          }
          if ((ulong)active_emulator_id == 0xffffffff) {
            uVar24 = 0;
          }
          else {
            uVar24 = (ulong)emulator_ids.
                            super__Vector_base<Emulator_Id,_std::allocator<Emulator_Id>_>._M_impl.
                            super__Vector_impl_data._M_start[active_emulator_id].player;
          }
          std::__cxx11::string::_M_assign((string *)(player_bank_file_abi_cxx11_ + uVar24));
          update_bank_mtime((TUI_context *)local_1258);
        }
        else {
          pcVar18 = (char *)gettext("Error loading the bank file.");
          std::__cxx11::string::string((string *)&local_10b8,pcVar18,(allocator *)&bankname_field);
          std::__cxx11::string::operator=((string *)&local_1158,(string *)&local_10b8);
          local_1138 = false;
          local_1134 = 10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
            operator_delete(local_10b8._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::_M_assign((string *)&local_1120);
      }
      bankname_field._M_string_length = 3;
      bankname_field.field_2._M_allocated_capacity._0_4_ = 0x697574;
      bankname_field._M_dataplus._M_p = (pointer)&bankname_field.field_2;
      IniProcessing::beginGroup(&configFile,&bankname_field);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bankname_field._M_dataplus._M_p != &bankname_field.field_2) {
        operator_delete(bankname_field._M_dataplus._M_p);
      }
      IniProcessing::setValue(&configFile,"bank_directory",&local_1120);
      psVar25 = player_bank_file_abi_cxx11_;
      lVar15 = 0;
      do {
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str,'\x01');
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,(uint)lVar15);
        in_R8 = (char *)0x9;
        plVar22 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x19855c);
        bankname_field._M_dataplus._M_p = (pointer)&bankname_field.field_2;
        psVar23 = (size_type *)(plVar22 + 2);
        if ((size_type *)*plVar22 == psVar23) {
          bankname_field.field_2._M_allocated_capacity = *psVar23;
          bankname_field.field_2._8_8_ = plVar22[3];
        }
        else {
          bankname_field.field_2._M_allocated_capacity = *psVar23;
          bankname_field._M_dataplus._M_p = (pointer)*plVar22;
        }
        bankname_field._M_string_length = plVar22[1];
        *plVar22 = (long)psVar23;
        plVar22[1] = 0;
        *(undefined1 *)(plVar22 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p);
        }
        IniProcessing::setValue(&configFile,bankname_field._M_dataplus._M_p,psVar25);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)bankname_field._M_dataplus._M_p != &bankname_field.field_2) {
          operator_delete(bankname_field._M_dataplus._M_p);
        }
        lVar15 = lVar15 + 1;
        psVar25 = psVar25 + 1;
      } while (lVar15 == 1);
      IniProcessing::endGroup(&configFile);
      IniProcessing::writeIniFile(&configFile);
      erase();
      std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr(&w);
      File_Selector::~File_Selector(&fs);
      if ((char *)pathbuf._64_8_ != pathbuf + 0x50) {
        operator_delete((void *)pathbuf._64_8_);
      }
      if ((char *)pathbuf._32_8_ != pathbuf + 0x30) {
        operator_delete((void *)pathbuf._32_8_);
      }
      if ((char *)pathbuf._0_8_ != pcVar16) {
        operator_delete((void *)pathbuf._0_8_);
      }
      break;
    case 0x43:
switchD_00119258_caseD_43:
      erase();
      in_R8 = (char *)0x0;
      pathbuf._0_8_ = derwin(_stdscr,_LINES,_COLS,0);
      Channel_Monitor::Channel_Monitor((Channel_Monitor *)&bankname_field);
      Channel_Monitor::setup_display((Channel_Monitor *)&bankname_field,(WINDOW *)pathbuf._0_8_);
      Channel_Monitor::setup_player((Channel_Monitor *)&bankname_field,pPVar4);
      Channel_Monitor::update
                ((Channel_Monitor *)&bankname_field,_Stack_10d8._M_head_impl,(uint)local_10d0,
                 local_10d0._4_4_);
      pvVar7 = local_10c0;
      p_Var6 = p_Stack_10c8;
      iVar10 = wgetch(_stdscr);
      iVar11 = 1;
      while (((bool)local_1258[0] == false &&
             (bVar9 = interface_interrupted(), !bVar9 && 0 < iVar11))) {
        if (p_Var6 != (_func_void_void_ptr *)0x0) {
          (*p_Var6)(pvVar7);
        }
        handle_notifications((TUI_context *)local_1258);
        bVar9 = handle_anylevel_key((TUI_context *)local_1258,iVar10);
        if (bVar9) {
          if (iVar10 == 0x19a) {
            in_R8 = (char *)0x0;
            uVar26 = derwin(_stdscr,_LINES,_COLS,0);
            bVar9 = pathbuf._0_8_ != 0;
            pathbuf._0_8_ = uVar26;
            if (bVar9) {
              delwin();
            }
            Channel_Monitor::setup_display
                      ((Channel_Monitor *)&bankname_field,(WINDOW *)pathbuf._0_8_);
          }
        }
        else {
          iVar11 = Channel_Monitor::key((Channel_Monitor *)&bankname_field,iVar10);
          Channel_Monitor::update
                    ((Channel_Monitor *)&bankname_field,_Stack_10d8._M_head_impl,(uint)local_10d0,
                     local_10d0._4_4_);
        }
        doupdate();
        iVar10 = wgetch(_stdscr);
      }
      erase();
      Channel_Monitor::~Channel_Monitor((Channel_Monitor *)&bankname_field);
      std::unique_ptr<_win_st,_WINDOW_deleter>::~unique_ptr
                ((unique_ptr<_win_st,_WINDOW_deleter> *)pathbuf);
      break;
    default:
      if (iVar10 == 0x2a) {
        if (0x1f2 < player_volume) {
          player_volume = 499;
        }
        player_volume = player_volume + 1;
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pcVar16;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
      }
      else {
        if (iVar10 != 0x2f) break;
        if (player_volume < 2) {
          player_volume = 1;
        }
        player_volume = player_volume + -1;
        builtin_strncpy(pathbuf + 0x10,"synth",6);
        pathbuf[8] = '\x05';
        pathbuf[9] = '\0';
        pathbuf[10] = '\0';
        pathbuf[0xb] = '\0';
        pathbuf[0xc] = '\0';
        pathbuf[0xd] = '\0';
        pathbuf[0xe] = '\0';
        pathbuf[0xf] = '\0';
        pathbuf._0_8_ = pcVar16;
        IniProcessing::beginGroup(&configFile,(string *)pathbuf);
      }
      if ((char *)pathbuf._0_8_ != pcVar16) {
        operator_delete((void *)pathbuf._0_8_);
      }
      pcVar16 = "volume";
      iVar10 = player_volume;
LAB_00119a95:
      IniProcessing::setValue(&configFile,pcVar16,iVar10);
LAB_00119abc:
      IniProcessing::endGroup(&configFile);
      IniProcessing::writeIniFile(&configFile);
    }
switchD_00119258_caseD_3d:
    doupdate();
  } while( true );
}

Assistant:

void curses_interface_exec(void (*idle_proc)(void *), void *idle_data)
{
    Screen screen;
    screen.init();

    TUI_context ctx;
    ctx.idle_proc = idle_proc;
    ctx.idle_data = idle_data;
#if defined(PDCURSES)
    install_event_hook(ctx);
#endif

    if (has_colors())
        setup_colors();
    raw();
    keypad(stdscr, true);
    noecho();
#ifdef ADLJACK_GTK3
    const unsigned timeout_ms = 1;
#else
    const unsigned timeout_ms = 50;
#endif
    timeout(timeout_ms);
    curs_set(0);
#if !defined(PDCURSES)
    set_escdelay(25);
#endif

#if defined(PDCURSES)
    PDC_set_title(get_program_title().c_str());
#endif

    {
        char pathbuf[PATH_MAX + 1];
        if (char *path = getcwd(pathbuf, sizeof(pathbuf)))
            ctx.bank_directory.assign(path);
    }

    configFile.beginGroup("tui");
    ctx.bank_directory = configFile.value("bank_directory", ctx.bank_directory).toString();
    configFile.endGroup();

#ifdef ADLJACK_GTK3
    s_tray_icon = create_tray_icon();

    if (active_player().type() == Player_Type::OPL3) {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "adljack");
    } else {
        gtk_status_icon_set_from_icon_name(s_tray_icon, "opnjack");
    }

    g_signal_connect(G_OBJECT(s_tray_icon), "popup-menu", G_CALLBACK(tray_icon_on_menu),  &ctx);
#endif

    setup_display(ctx);
    show_status(ctx, _("Ready!"));

    unsigned bank_check_interval = 1;
    stc::steady_clock::time_point bank_check_last = stc::steady_clock::now();

    while (!ctx.quit && !interface_interrupted()) {
        if (idle_proc)
            idle_proc(idle_data);

        handle_notifications(ctx);

        Player *player = have_active_player() ? &active_player() : nullptr;
        if (ctx.player != player) {
            ctx.player = player;
            update_bank_mtime(ctx);
        }

        stc::steady_clock::time_point now = stc::steady_clock::now();
        if (now - bank_check_last > stc::seconds(bank_check_interval)) {
            if (update_bank_mtime(ctx)) {
                if (ctx.player->dynamic_load_bank(active_bank_file().c_str()))
                    show_status(ctx, _("Bank has changed on disk. Reload!"));
                else
                    show_status(ctx, _("Bank has changed on disk. Reloading failed."));
            }
            bank_check_last = now;
        }

        update_display(ctx);

#ifdef ADLJACK_GTK3
        gtk_main_iteration_do(false);
#endif
        int key = getch();
        if (!handle_anylevel_key(ctx, key))
            handle_toplevel_key(ctx, key);
        doupdate();
    }
    ctx.win = TUI_windows();
    screen.end();

#ifdef ADLJACK_GTK3
    gtk_status_icon_set_visible(s_tray_icon, FALSE);
#endif

    if (interface_interrupted())
        fprintf(stderr, "Interrupted.\n");
}